

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::io::ArrayInputStream::Skip(ArrayInputStream *this,int count)

{
  int iVar1;
  Nonnull<const_char_*> pcVar2;
  int iVar3;
  
  if (count < 0) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)count,0,"count >= 0");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    this->last_returned_size_ = 0;
    iVar1 = this->size_ - this->position_;
    iVar3 = this->position_ + count;
    if (iVar1 < count) {
      iVar3 = this->size_;
    }
    this->position_ = iVar3;
    return count <= iVar1;
  }
  Skip();
}

Assistant:

bool ArrayInputStream::Skip(int count) {
  ABSL_CHECK_GE(count, 0);
  last_returned_size_ = 0;  // Don't let caller back up.
  if (count > size_ - position_) {
    position_ = size_;
    return false;
  } else {
    position_ += count;
    return true;
  }
}